

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O2

void Gia_ManMarkSeqGiaWithBoxes(Gia_Man_t *p,int fSeq)

{
  Tim_Man_t *p_00;
  uint __line;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *p_01;
  char *__assertion;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  iVar1 = Tim_ManPiNum(p_00);
  iVar2 = Tim_ManPoNum(p_00);
  if (fSeq == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = Gia_ManRegBoxNum(p);
  }
  if (p->nRegs == 0) {
    iVar4 = Gia_ManBoxNum(p);
    if (0 < iVar4) {
      Gia_ManIncrementTravId(p);
      Gia_ObjSetTravIdCurrent(p,p->pObjs);
      iVar1 = iVar1 - iVar3;
      iVar4 = 0;
      if (iVar1 < 1) {
        iVar1 = 0;
        iVar4 = 0;
      }
      for (; iVar1 != iVar4; iVar4 = iVar4 + 1) {
        if (p->vCis->nSize - p->nRegs <= iVar4) {
          __assert_fail("v < Gia_ManPiNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
        }
        pGVar5 = Gia_ManCi(p,iVar4);
        Gia_ObjSetTravIdCurrent(p,pGVar5);
      }
      iVar1 = Gia_ManRegBoxNum(p);
      p_01 = Vec_IntAlloc(iVar1);
      iVar1 = p->vCos->nSize;
      iVar4 = p->nRegs;
      for (iVar2 = iVar1 - (iVar2 + iVar4); iVar2 < iVar1 - (iVar4 + iVar3); iVar2 = iVar2 + 1) {
        pGVar5 = Gia_ManPo(p,iVar2);
        Gia_ObjSetTravIdCurrent(p,pGVar5);
        pGVar5 = Gia_ManPo(p,iVar2);
        Gia_ManMarkSeqGiaWithBoxes_rec
                  (p,pGVar5 + -(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff),p_01);
        iVar1 = p->vCos->nSize;
        iVar4 = p->nRegs;
      }
      if (fSeq != 0) {
        for (iVar1 = 0; iVar1 < p_01->nSize; iVar1 = iVar1 + 1) {
          iVar2 = Vec_IntEntry(p_01,iVar1);
          pGVar5 = Gia_ManObj(p,iVar2);
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          if ((-1 < (int)(uint)*(undefined8 *)pGVar5) ||
             (((uint)*(undefined8 *)pGVar5 & 0x1fffffff) == 0x1fffffff)) {
            __assertion = "Gia_ObjIsCo(pObj)";
            __line = 0x74;
            goto LAB_00206ccb;
          }
          Gia_ObjSetTravIdCurrent(p,pGVar5);
          Gia_ManMarkSeqGiaWithBoxes_rec
                    (p,pGVar5 + -(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff),p_01);
        }
      }
      Vec_IntFree(p_01);
      return;
    }
    __assertion = "Gia_ManBoxNum(p) > 0";
    __line = 0x62;
  }
  else {
    __assertion = "Gia_ManRegNum(p) == 0";
    __line = 0x61;
  }
LAB_00206ccb:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                ,__line,"void Gia_ManMarkSeqGiaWithBoxes(Gia_Man_t *, int)");
}

Assistant:

void Gia_ManMarkSeqGiaWithBoxes( Gia_Man_t * p, int fSeq )
{
    // CI order: real PIs + flop outputs + box outputs
    // CO order: box inputs + real POs + flop inputs
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Vec_Int_t * vRoots;
    Gia_Obj_t * pObj;
    int nRealCis = Tim_ManPiNum(pManTime);
    int nRealCos = Tim_ManPoNum(pManTime);
    int i, nRegs = fSeq ? Gia_ManRegBoxNum(p) : 0;
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManBoxNum(p) > 0 );
    // mark the terminals
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    for ( i = 0; i < nRealCis - nRegs; i++ )
        Gia_ObjSetTravIdCurrent( p, Gia_ManPi(p, i) );
    // collect flops reachable from the POs
    vRoots = Vec_IntAlloc( Gia_ManRegBoxNum(p) );
    for ( i = Gia_ManPoNum(p) - nRealCos; i < Gia_ManPoNum(p) - nRegs; i++ )
    {
        Gia_ObjSetTravIdCurrent( p, Gia_ManPo(p, i) );
        Gia_ManMarkSeqGiaWithBoxes_rec( p, Gia_ObjFanin0(Gia_ManPo(p, i)), vRoots );
    }
    // collect flops reachable from roots
    if ( fSeq )
    {
        Gia_ManForEachObjVec( vRoots, p, pObj, i )
        {
            assert( Gia_ObjIsCo(pObj) );
            Gia_ObjSetTravIdCurrent( p, pObj );
            Gia_ManMarkSeqGiaWithBoxes_rec( p, Gia_ObjFanin0(pObj), vRoots );
        }
        //printf( "Explored %d flops\n", Vec_IntSize(vRoots) );
    }
    Vec_IntFree( vRoots );
}